

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseFailureIncludesCheckExpectedAndActual::
~TestCheckArrayCloseFailureIncludesCheckExpectedAndActual
          (TestCheckArrayCloseFailureIncludesCheckExpectedAndActual *this)

{
  TestCheckArrayCloseFailureIncludesCheckExpectedAndActual *this_local;
  
  ~TestCheckArrayCloseFailureIncludesCheckExpectedAndActual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayCloseFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "xpected [ 0 1 2 3 ]"));
    CHECK(strstr(reporter.lastFailedMessage, "was [ 0 1 3 3 ]"));
}